

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FailStep FVar1;
  FailStep FVar2;
  ostream *poVar3;
  uint uVar4;
  long local_280;
  ifstream file;
  byte abStack_260 [200];
  undefined8 auStack_198 [36];
  undefined1 local_78 [8];
  string contents;
  string fileName;
  string failStepString;
  
  if (argc == 3) {
    contents.field_2._8_8_ = &fileName._M_string_length;
    fileName._M_dataplus._M_p = (pointer)0x0;
    fileName.field_2._8_8_ = &failStepString._M_string_length;
    failStepString._M_dataplus._M_p = (pointer)0x0;
    fileName._M_string_length._0_1_ = 0;
    failStepString._M_string_length._0_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,argv[1],(allocator<char> *)local_78);
    std::__cxx11::string::operator=
              ((string *)(contents.field_2._M_local_buf + 8),(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,argv[2],(allocator<char> *)local_78);
    std::__cxx11::string::operator=
              ((string *)(fileName.field_2._M_local_buf + 8),(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    poVar3 = std::operator<<((ostream *)&std::cout,"Running file: ");
    poVar3 = std::operator<<(poVar3,(string *)(contents.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)(fileName.field_2._M_local_buf + 8));
    std::endl<char,std::char_traits<char>>(poVar3);
    FVar1 = failStepFromString((string *)((long)&fileName.field_2 + 8));
    std::ifstream::ifstream(&local_280,(string *)(contents.field_2._M_local_buf + 8),_S_in);
    if ((abStack_260[*(long *)(local_280 + -0x18)] & 5) == 0) {
      local_78 = (undefined1  [8])&contents._M_string_length;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)local_78,
                 *(undefined8 *)((long)auStack_198 + *(long *)(local_280 + -0x18)),
                 0xffffffffffffffff,0,0xffffffff);
      FVar2 = run((string *)local_78);
      uVar4 = (uint)(FVar2 != FVar1);
      std::__cxx11::string::~string((string *)local_78);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"file.fail is true, file may not exist! ");
      poVar3 = std::operator<<(poVar3,(string *)(contents.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)(fileName.field_2._M_local_buf + 8));
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar4 = 1;
    }
    std::ifstream::~ifstream(&local_280);
    std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(contents.field_2._M_local_buf + 8));
  }
  else {
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int main(int argc, char** argv) {

  if (argc != 3) {
    return 1;
  }

  std::string fileName;
  std::string failStepString;

  try {

    fileName = std::string{argv[1]};
    failStepString = std::string(argv[2]);

    std::cout << "Running file: " << fileName << " " << failStepString << std::endl;

    FailStep failStep = failStepFromString(failStepString);

    std::ifstream file{fileName};

    if (file.fail()) {
      std::cerr << "file.fail is true, file may not exist! " << fileName << " " << failStepString << std::endl;
      return 1;
    }

    std::string contents{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()};

    FailStep actualFailStep = run(contents);

    if (actualFailStep != failStep) {
      return 1;
    }

  } catch (...) {
    std::cerr << "Caught exception! " << fileName << " " << failStepString << std::endl;

    return 1;
  }

  return 0;
}